

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

ssize_t __thiscall
Json::FastWriter::write_abi_cxx11_(FastWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined4 in_register_00000034;
  FastWriter *this_00;
  
  this_00 = (FastWriter *)CONCAT44(in_register_00000034,__fd);
  (this_00->document_)._M_string_length = 0;
  *(this_00->document_)._M_dataplus._M_p = '\0';
  writeValue(this_00,(Value *)__buf);
  if (this_00->omitEndingLineFeed_ == false) {
    std::__cxx11::string::append((char *)&this_00->document_);
  }
  std::__cxx11::string::string((string *)this,(string *)&this_00->document_);
  return (ssize_t)this;
}

Assistant:

JSONCPP_STRING FastWriter::write(const Value& root) {
  document_.clear();
  writeValue(root);
  if (!omitEndingLineFeed_)
    document_ += "\n";
  return document_;
}